

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::MessageReference::~MessageReference(MessageReference *this)

{
  std::unique_ptr<bool,_std::default_delete<bool>_>::~unique_ptr
            (&(this->fail_if_not_exists).super_field<bool>.t_);
  std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
            (&(this->guild_id).super_field<discordpp::Snowflake>.t_);
  std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
            (&(this->channel_id).super_field<discordpp::Snowflake>.t_);
  std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
            (&(this->message_id).super_field<discordpp::Snowflake>.t_);
  return;
}

Assistant:

MessageReference(
        omittable_field<Snowflake> message_id = omitted,
        omittable_field<Snowflake> channel_id = omitted,
        omittable_field<Snowflake> guild_id = omitted,
        omittable_field<bool> fail_if_not_exists = omitted
    ):
        message_id(message_id),
        channel_id(channel_id),
        guild_id(guild_id),
        fail_if_not_exists(fail_if_not_exists)
    {}